

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void read_pop(macros *ma)

{
  wchar_t local_14;
  wchar_t i;
  macros *ma_local;
  
  free(*ma->macro);
  for (local_14 = L'\0'; local_14 < ma->level; local_14 = local_14 + L'\x01') {
    ma->macro[local_14] = ma->macro[local_14 + L'\x01'];
  }
  ma->level = ma->level + L'\xffffffff';
  ma->offset = L'\0';
  return;
}

Assistant:

static void
read_pop(struct macros *ma)
{
	int i;

	el_free(ma->macro[0]);
	for (i = 0; i < ma->level; i++)
		ma->macro[i] = ma->macro[i + 1];
	ma->level--;
	ma->offset = 0;
}